

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O0

bool asio_service_test::test_read_empty_meta
               (atomic<unsigned_long> *count,meta_cb_params *params,string *meta)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  ostream *poVar4;
  size_t sVar5;
  void *this;
  string *in_RDX;
  __atomic_base<unsigned_long> *in_RDI;
  string _v;
  string _ev;
  lock_guard<std::mutex> l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  hash<std::thread::id> *in_stack_fffffffffffffe30;
  string local_98 [48];
  string local_68 [32];
  string local_48 [40];
  string *local_20;
  __atomic_base<unsigned_long> *local_10;
  byte local_1;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe30,
             (mutex_type *)in_stack_fffffffffffffe28);
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68,local_20);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (bVar1) {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_98);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
    _Var3 = std::setw(4);
    poVar4 = std::operator<<(poVar4,_Var3);
    _Var2 = std::setfill<char>('0');
    poVar4 = std::operator<<(poVar4,_Var2._M_c);
    std::this_thread::get_id();
    sVar5 = std::hash<std::thread::id>::operator()
                      (in_stack_fffffffffffffe30,(id *)in_stack_fffffffffffffe28);
    this = (void *)std::ostream::operator<<(poVar4,sVar5 & 0xffff);
    poVar4 = (ostream *)std::ostream::operator<<(this,std::dec);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"test_read_empty_meta");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x210);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mmeta\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,local_48);
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = std::operator<<(poVar4,local_68);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_98);
    TestSuite::failHandler();
    local_1 = 1;
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  if (!bVar1) {
    if (local_10 != (__atomic_base<unsigned_long> *)0x0) {
      std::__atomic_base<unsigned_long>::operator++(local_10,0);
    }
    local_1 = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1935e1);
  return (bool)(local_1 & 1);
}

Assistant:

bool test_read_empty_meta( std::atomic<size_t>* count,
                           const asio_service::meta_cb_params& params,
                           const std::string& meta )
{
    static std::mutex lock;
    std::lock_guard<std::mutex> l(lock);

    CHK_EQ( std::string(), meta );

    if (count) (*count)++;
    return true;
}